

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_status(int op,int *pCurrent,int *pHighwater,int resetFlag)

{
  int iVar1;
  int iVar2;
  
  if ((uint)op < 10) {
    iVar1 = sqlite3Stat.nowValue[(uint)op];
    *pCurrent = iVar1;
    *pHighwater = sqlite3Stat.mxValue[(uint)op];
    iVar2 = 0;
    if (resetFlag != 0) {
      sqlite3Stat.mxValue[(uint)op] = iVar1;
      iVar2 = 0;
    }
  }
  else {
    sqlite3_log(0x15,"misuse at line %d of [%.10s]",0x35e5,
                "118a3b35693b134d56ebd780123b7fd6f1497668");
    iVar2 = 0x15;
  }
  return iVar2;
}

Assistant:

SQLITE_API int sqlite3_status(int op, int *pCurrent, int *pHighwater, int resetFlag){
  wsdStatInit;
  if( op<0 || op>=ArraySize(wsdStat.nowValue) ){
    return SQLITE_MISUSE_BKPT;
  }
  *pCurrent = wsdStat.nowValue[op];
  *pHighwater = wsdStat.mxValue[op];
  if( resetFlag ){
    wsdStat.mxValue[op] = wsdStat.nowValue[op];
  }
  return SQLITE_OK;
}